

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<mp::Reference>::Matcher(Matcher<mp::Reference> *this,Reference value)

{
  EqMatcher<mp::Reference> this_00;
  ExprBase in_RDI;
  EqMatcher<mp::Reference> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::Reference>::MatcherBase((MatcherBase<mp::Reference> *)0x15016c);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_0029f428;
  this_00 = Eq<mp::Reference>((Reference)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::Reference> *)
            this_00.rhs_.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_,
            (Matcher<mp::Reference> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::Reference> *)0x1501ca);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }